

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls.c
# Opt level: O0

int cvNlsConvTest(SUNNonlinearSolver NLS,N_Vector ycor,N_Vector delta,sunrealtype tol,N_Vector ewt,
                 void *cvode_mem)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  sunrealtype dcon;
  sunrealtype del;
  int retval;
  int m;
  CVodeMem cv_mem;
  double local_78;
  double local_70;
  double local_60;
  int local_44;
  long local_40;
  undefined8 local_30;
  double local_28;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  if (in_R8 == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x139,"cvNlsConvTest",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_40 = in_R8;
    local_30 = in_RCX;
    local_28 = in_XMM0_Qa;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_78 = (double)N_VWrmsNorm(in_RDX,in_RCX);
    iVar1 = SUNNonlinSolGetCurIter(local_10,&local_44);
    if (iVar1 == 0) {
      if (0 < local_44) {
        if (*(double *)(local_40 + 0x540) * 0.3 <= local_78 / *(double *)(local_40 + 0x550)) {
          local_60 = local_78 / *(double *)(local_40 + 0x550);
        }
        else {
          local_60 = *(double *)(local_40 + 0x540) * 0.3;
        }
        *(double *)(local_40 + 0x540) = local_60;
      }
      if (*(double *)(local_40 + 0x540) <= 1.0) {
        local_70 = *(double *)(local_40 + 0x540);
      }
      else {
        local_70 = 1.0;
      }
      if (1.0 < (local_78 * local_70) / local_28) {
        if ((local_44 < 1) || (local_78 <= *(double *)(local_40 + 0x550) * 2.0)) {
          *(double *)(local_40 + 0x550) = local_78;
          local_4 = 0x385;
        }
        else {
          local_4 = 0x386;
        }
      }
      else {
        if (local_44 != 0) {
          local_78 = (double)N_VWrmsNorm(local_18,local_30);
        }
        *(double *)(local_40 + 0x558) = local_78;
        *(undefined4 *)(local_40 + 0x560) = 1;
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x15;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsConvTest(SUNNonlinearSolver NLS, N_Vector ycor, N_Vector delta,
                         sunrealtype tol, N_Vector ewt, void* cvode_mem)
{
  CVodeMem cv_mem;
  int m, retval;
  sunrealtype del;
  sunrealtype dcon;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* compute the norm of the correction */
  del = N_VWrmsNorm(delta, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != CV_SUCCESS) { return (CV_MEM_NULL); }

  /* Test for convergence. If m > 0, an estimate of the convergence
     rate constant is stored in crate, and used in the test.        */
  if (m > 0)
  {
    cv_mem->cv_crate = SUNMAX(CRDOWN * cv_mem->cv_crate, del / cv_mem->cv_delp);
  }
  dcon = del * SUNMIN(ONE, cv_mem->cv_crate) / tol;

  if (dcon <= ONE)
  {
    cv_mem->cv_acnrm    = (m == 0) ? del : N_VWrmsNorm(ycor, ewt);
    cv_mem->cv_acnrmcur = SUNTRUE;
    return (CV_SUCCESS); /* Nonlinear system was solved successfully */
  }

  /* check if the iteration seems to be diverging */
  if ((m >= 1) && (del > RDIV * cv_mem->cv_delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* Save norm of correction and loop again */
  cv_mem->cv_delp = del;

  /* Not yet converged */
  return (SUN_NLS_CONTINUE);
}